

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nng.c
# Opt level: O1

int nng_thread_create(nng_thread **thrp,_func_void_void_ptr *func,void *arg)

{
  int iVar1;
  nni_thr *thr;
  
  thr = (nni_thr *)nni_zalloc(0x98);
  if (thr == (nni_thr *)0x0) {
    iVar1 = 2;
  }
  else {
    *thrp = (nng_thread *)thr;
    iVar1 = nni_thr_init(thr,func,arg);
    if (iVar1 == 0) {
      nni_thr_run(thr);
      iVar1 = 0;
    }
  }
  return iVar1;
}

Assistant:

int
nng_thread_create(nng_thread **thrp, void (*func)(void *), void *arg)
{
	nni_thr *thr;
	int      rv;

	if ((thr = NNI_ALLOC_STRUCT(thr)) == NULL) {
		return (NNG_ENOMEM);
	}
	*thrp = (void *) thr;
	if ((rv = nni_thr_init(thr, func, arg)) != 0) {
		return (rv);
	}
	nni_thr_run(thr);
	return (0);
}